

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldDescriptor
          (Generator *this,FieldDescriptor *field,bool is_extension)

{
  code *buffer;
  float value;
  double value_00;
  FieldDescriptor FVar1;
  long lVar2;
  long lVar3;
  mapped_type *pmVar4;
  long *plVar5;
  undefined8 *puVar6;
  EnumValueDescriptor *pEVar7;
  LogMessage *other;
  code *pcVar8;
  long *plVar9;
  undefined7 in_register_00000011;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  protobuf *this_00;
  char *pcVar11;
  char *pcVar12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string options_string;
  char field_descriptor_decl [409];
  key_type local_280;
  undefined1 local_260 [36];
  undefined4 local_23c;
  Generator *local_238;
  FieldDescriptor *local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  string local_1f8;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [25];
  FieldDescriptor *local_38;
  
  local_23c = (undefined4)CONCAT71(in_register_00000011,is_extension);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_238 = this;
  MessageLite::SerializeToString(*(MessageLite **)(field + 0x78),&local_1f8);
  local_228._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_228._M_impl.super__Rb_tree_header._M_header;
  local_228._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_228._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_228._M_impl.super__Rb_tree_header._M_node_count = 0;
  buffer = (code *)(local_1d8 + 0x10);
  local_228._M_impl.super__Rb_tree_header._M_header._M_right =
       local_228._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1d8._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,(key_type *)local_1d8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((code *)local_1d8._0_8_ != buffer) {
    operator_delete((void *)local_1d8._0_8_);
  }
  local_1d8._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"full_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,(key_type *)local_1d8);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((code *)local_1d8._0_8_ != buffer) {
    operator_delete((void *)local_1d8._0_8_);
  }
  if (field[0x42] == (FieldDescriptor)0x0) {
    plVar5 = (long *)(*(long *)(field + 0x50) + 0x28);
  }
  else if (*(long *)(field + 0x60) == 0) {
    plVar5 = (long *)(*(long *)(field + 0x28) + 0x80);
  }
  else {
    plVar5 = (long *)(*(long *)(field + 0x60) + 0x50);
  }
  local_1d8._0_8_ = buffer;
  local_1d8._8_8_ =
       FastInt32ToBufferLeft((int)((ulong)((long)field - *plVar5) >> 3) * 0x286bca1b,(char *)buffer)
  ;
  local_1d8._8_8_ = local_1d8._8_8_ + -(long)buffer;
  local_260._0_8_ = local_260 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_260,local_1d8._0_8_,(char *)(local_1d8._8_8_ + local_1d8._0_8_));
  paVar10 = &local_280.field_2;
  local_280._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"index","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,&local_280);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar10) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_);
  }
  local_1d8._0_8_ = buffer;
  local_1d8._8_8_ = FastInt32ToBufferLeft(*(int32 *)(field + 0x44),(char *)buffer);
  local_1d8._8_8_ = local_1d8._8_8_ + -(long)buffer;
  local_260._0_8_ = local_260 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_260,local_1d8._0_8_,(char *)(local_1d8._8_8_ + local_1d8._0_8_));
  local_280._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"number","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,&local_280);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar10) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_280._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_230 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_280,
               &local_230);
  }
  local_1d8._0_8_ = buffer;
  local_1d8._8_8_ = FastInt32ToBufferLeft(*(int32 *)(field + 0x38),(char *)buffer);
  local_1d8._8_8_ = local_1d8._8_8_ + -(long)buffer;
  local_260._0_8_ = local_260 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_260,local_1d8._0_8_,(char *)(local_1d8._8_8_ + local_1d8._0_8_));
  local_280._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"type","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,&local_280);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar10) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_280._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_230 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_280,
               &local_230);
  }
  local_1d8._0_8_ = buffer;
  local_1d8._8_8_ =
       FastInt32ToBufferLeft
                 (*(int32 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4
                            ),(char *)buffer);
  local_1d8._8_8_ = local_1d8._8_8_ + -(long)buffer;
  local_260._0_8_ = local_260 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_260,local_1d8._0_8_,(char *)(local_1d8._8_8_ + local_1d8._0_8_));
  local_280._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"cpp_type","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,&local_280);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar10) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_);
  }
  local_1d8._0_8_ = buffer;
  local_1d8._8_8_ = FastInt32ToBufferLeft(*(int32 *)(field + 0x3c),(char *)buffer);
  local_1d8._8_8_ = local_1d8._8_8_ + -(long)buffer;
  local_260._0_8_ = local_260 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_260,local_1d8._0_8_,(char *)(local_1d8._8_8_ + local_1d8._0_8_));
  local_280._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"label","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,&local_280);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar10) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_260._0_8_ != (FieldDescriptor *)(local_260 + 0x10)) {
    operator_delete((void *)local_260._0_8_);
  }
  pcVar11 = "False";
  pcVar12 = "False";
  if (field[0x40] != (FieldDescriptor)0x0) {
    pcVar12 = "True";
  }
  local_1d8._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"has_default_value","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,(key_type *)local_1d8);
  this_00 = (protobuf *)0x0;
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,(ulong)pcVar12);
  if ((code *)local_1d8._0_8_ != buffer) {
    operator_delete((void *)local_1d8._0_8_);
  }
  if (*(int *)(field + 0x3c) == 3) {
    local_280.field_2._M_local_buf[0] = '[';
    local_280.field_2._M_local_buf[1] = ']';
    local_280._M_string_length = 2;
    local_280.field_2._M_local_buf[2] = '\0';
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    goto LAB_002788db;
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    this_00 = (protobuf *)local_1d8;
    local_1d8._0_8_ = FieldDescriptor::TypeOnceInit;
    local_260._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)this_00,
               (FieldDescriptor **)local_260);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    local_1d8._0_8_ = buffer;
    local_1d8._8_8_ = FastInt32ToBufferLeft(*(int32 *)(field + 0x90),(char *)buffer);
    local_1d8._8_8_ = local_1d8._8_8_ + -(long)buffer;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,local_1d8._0_8_,(char *)(local_1d8._8_8_ + local_1d8._0_8_));
    break;
  case 2:
    local_1d8._0_8_ = buffer;
    local_1d8._8_8_ = FastInt64ToBufferLeft(*(int64 *)(field + 0x90),(char *)buffer);
    local_1d8._8_8_ = local_1d8._8_8_ + -(long)buffer;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,local_1d8._0_8_,(char *)(local_1d8._8_8_ + local_1d8._0_8_));
    break;
  case 3:
    local_1d8._0_8_ = buffer;
    local_1d8._8_8_ = FastUInt32ToBufferLeft(*(uint32 *)(field + 0x90),(char *)buffer);
    local_1d8._8_8_ = local_1d8._8_8_ + -(long)buffer;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,local_1d8._0_8_,(char *)(local_1d8._8_8_ + local_1d8._0_8_));
    break;
  case 4:
    local_1d8._0_8_ = buffer;
    local_1d8._8_8_ = FastUInt64ToBufferLeft(*(uint64 *)(field + 0x90),(char *)buffer);
    local_1d8._8_8_ = local_1d8._8_8_ + -(long)buffer;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,local_1d8._0_8_,(char *)(local_1d8._8_8_ + local_1d8._0_8_));
    break;
  case 5:
    value_00 = *(double *)(field + 0x90);
    if (INFINITY <= value_00) {
LAB_00278e12:
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      local_280.field_2._M_local_buf[0] = '1';
      local_280.field_2._M_local_buf[1] = 'e';
      local_280.field_2._M_local_buf[2] = '1';
      local_280.field_2._M_local_buf[3] = '0';
      local_280.field_2._M_local_buf[4] = '0';
      local_280.field_2._M_allocated_capacity._5_2_ = 0x3030;
      local_280._M_string_length = 7;
      local_280.field_2._M_local_buf[7] = '\0';
      break;
    }
    if (value_00 <= -INFINITY) {
LAB_00278f4d:
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      local_280.field_2._M_local_buf[0] = '-';
      local_280.field_2._M_local_buf[1] = '1';
      local_280.field_2._M_local_buf[2] = 'e';
      local_280.field_2._M_local_buf[3] = '1';
      local_280.field_2._M_local_buf[4] = '0';
      local_280.field_2._M_allocated_capacity._5_2_ = 0x3030;
      local_280.field_2._M_local_buf[7] = '0';
      local_280._M_string_length = 8;
      local_280.field_2._M_local_buf[8] = '\0';
      break;
    }
    if (NAN(value_00)) {
LAB_002790be:
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      local_280.field_2._M_local_buf[0] = '(';
      local_280.field_2._M_local_buf[1] = '1';
      local_280.field_2._M_local_buf[2] = 'e';
      local_280.field_2._M_local_buf[3] = '1';
      local_280.field_2._M_local_buf[4] = '0';
      local_280.field_2._M_allocated_capacity._5_2_ = 0x3030;
      local_280.field_2._M_local_buf[7] = '0';
      local_280.field_2._M_local_buf[8] = ' ';
      local_280.field_2._9_4_ = 0x2930202a;
      local_280._M_string_length = 0xd;
      local_280.field_2._M_local_buf[0xd] = '\0';
      break;
    }
    SimpleDtoa_abi_cxx11_((string *)local_260,this_00,value_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   "float(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_260);
    plVar5 = (long *)std::__cxx11::string::append(local_1d8);
    goto LAB_0027904c;
  case 6:
    value = *(float *)(field + 0x90);
    if (INFINITY <= value) goto LAB_00278e12;
    if (value <= -INFINITY) goto LAB_00278f4d;
    if (NAN(value)) goto LAB_002790be;
    SimpleFtoa_abi_cxx11_((string *)local_260,this_00,value);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   "float(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_260);
    plVar5 = (long *)std::__cxx11::string::append(local_1d8);
LAB_0027904c:
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5;
    plVar9 = plVar5 + 2;
    if (paVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar9) {
      lVar2 = *plVar9;
      lVar3 = plVar5[3];
      local_280.field_2._M_local_buf[0] = (char)lVar2;
      local_280.field_2._M_local_buf[1] = (char)((ulong)lVar2 >> 8);
      local_280.field_2._M_local_buf[2] = (char)((ulong)lVar2 >> 0x10);
      local_280.field_2._M_local_buf[3] = (char)((ulong)lVar2 >> 0x18);
      local_280.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
      local_280.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)lVar2 >> 0x28);
      local_280.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
      local_280.field_2._M_local_buf[8] = (char)lVar3;
      local_280.field_2._9_4_ = (undefined4)((ulong)lVar3 >> 8);
      local_280.field_2._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
      local_280.field_2._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
    }
    else {
LAB_00279060:
      lVar2 = *plVar9;
      local_280.field_2._M_local_buf[0] = (char)lVar2;
      local_280.field_2._M_local_buf[1] = (char)((ulong)lVar2 >> 8);
      local_280.field_2._M_local_buf[2] = (char)((ulong)lVar2 >> 0x10);
      local_280.field_2._M_local_buf[3] = (char)((ulong)lVar2 >> 0x18);
      local_280.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
      local_280.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)lVar2 >> 0x28);
      local_280.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
      local_280._M_dataplus._M_p = (pointer)paVar10;
    }
LAB_0027906d:
    local_280._M_string_length = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((code *)local_1d8._0_8_ != buffer) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if ((FieldDescriptor *)local_260._0_8_ != (FieldDescriptor *)(local_260 + 0x10)) {
      operator_delete((void *)local_260._0_8_);
    }
    break;
  case 7:
    pcVar12 = "False";
    if ((ulong)(byte)field[0x90] != 0) {
      pcVar12 = "True";
    }
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,pcVar12,pcVar12 + ((ulong)(byte)field[0x90] ^ 5));
    break;
  case 8:
    pEVar7 = FieldDescriptor::default_value_enum(field);
    local_1d8._0_8_ = buffer;
    local_1d8._8_8_ = FastInt32ToBufferLeft(*(int32 *)(pEVar7 + 0x10),(char *)buffer);
    local_1d8._8_8_ = local_1d8._8_8_ + -(long)buffer;
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,local_1d8._0_8_,(char *)(local_1d8._8_8_ + local_1d8._0_8_));
    break;
  case 9:
    CEscape((string *)local_260,*(string **)(field + 0x90));
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)local_260,0,(char *)0x0,0x3a1661);
    pcVar8 = (code *)(puVar6 + 2);
    if ((code *)*puVar6 == pcVar8) {
      local_1c8[0]._0_8_ = *(undefined8 *)pcVar8;
      local_1c8[0]._8_8_ = puVar6[3];
      local_1d8._0_8_ = buffer;
    }
    else {
      local_1c8[0]._0_8_ = *(undefined8 *)pcVar8;
      local_1d8._0_8_ = (code *)*puVar6;
    }
    local_1d8._8_8_ = puVar6[1];
    *puVar6 = pcVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_230 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_38 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_230,
                 &local_38);
    }
    plVar5 = (long *)std::__cxx11::string::append(local_1d8);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5;
    plVar9 = plVar5 + 2;
    if (paVar10 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar9) goto LAB_00279060;
    lVar2 = *plVar9;
    lVar3 = plVar5[3];
    local_280.field_2._M_local_buf[0] = (char)lVar2;
    local_280.field_2._M_local_buf[1] = (char)((ulong)lVar2 >> 8);
    local_280.field_2._M_local_buf[2] = (char)((ulong)lVar2 >> 0x10);
    local_280.field_2._M_local_buf[3] = (char)((ulong)lVar2 >> 0x18);
    local_280.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
    local_280.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)lVar2 >> 0x28);
    local_280.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
    local_280.field_2._M_local_buf[8] = (char)lVar3;
    local_280.field_2._9_4_ = (undefined4)((ulong)lVar3 >> 8);
    local_280.field_2._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
    local_280.field_2._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    goto LAB_0027906d;
  case 10:
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    local_280.field_2._M_local_buf[0] = 'N';
    local_280.field_2._M_local_buf[1] = 'o';
    local_280.field_2._M_local_buf[2] = 'n';
    local_280.field_2._M_local_buf[3] = 'e';
    local_280._M_string_length = 4;
    local_280.field_2._M_local_buf[4] = '\0';
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_1d8,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x120);
    other = internal::LogMessage::operator<<((LogMessage *)local_1d8,"Not reached.");
    internal::LogFinisher::operator=((LogFinisher *)local_260,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_1d8);
    local_280._M_string_length = 0;
    local_280.field_2._M_local_buf[0] = '\0';
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  }
LAB_002788db:
  local_1d8._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"default_value","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,(key_type *)local_1d8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_280);
  paVar10 = &local_280.field_2;
  if ((code *)local_1d8._0_8_ != buffer) {
    operator_delete((void *)local_1d8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar10) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((char)local_23c != '\0') {
    pcVar11 = "True";
  }
  local_1d8._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"is_extension","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,(key_type *)local_1d8);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,(ulong)pcVar11);
  if ((code *)local_1d8._0_8_ != buffer) {
    operator_delete((void *)local_1d8._0_8_);
  }
  OptionsValue((string *)local_1d8,local_238,&local_1f8);
  local_260._0_8_ = local_260 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"serialized_options","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,(key_type *)local_260);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_1d8);
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_);
  }
  if ((code *)local_1d8._0_8_ != buffer) {
    operator_delete((void *)local_1d8._0_8_);
  }
  FVar1 = field[0x41];
  if (FVar1 == (FieldDescriptor)0x1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   ", json_name=\'",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (field + 0x20));
    puVar6 = (undefined8 *)std::__cxx11::string::append(local_260);
    pcVar8 = (code *)(puVar6 + 2);
    if ((code *)*puVar6 == pcVar8) {
      local_1c8[0]._0_8_ = *(undefined8 *)pcVar8;
      local_1c8[0]._8_8_ = puVar6[3];
      local_1d8._0_8_ = buffer;
    }
    else {
      local_1c8[0]._0_8_ = *(undefined8 *)pcVar8;
      local_1d8._0_8_ = (code *)*puVar6;
    }
    local_1d8._8_8_ = puVar6[1];
    *puVar6 = pcVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
  }
  else {
    local_1d8._0_8_ = buffer;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"");
  }
  local_280._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"json_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_228,&local_280);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar10) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((code *)local_1d8._0_8_ != buffer) {
    operator_delete((void *)local_1d8._0_8_);
  }
  if ((FVar1 != (FieldDescriptor)0x0) && ((undefined1 *)local_260._0_8_ != local_260 + 0x10)) {
    operator_delete((void *)local_260._0_8_);
  }
  memcpy(local_1d8,
         "_descriptor.FieldDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\', index=$index$,\n  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n  has_default_value=$has_default_value$, default_value=$default_value$,\n  message_type=None, enum_type=None, containing_type=None,\n  is_extension=$is_extension$, extension_scope=None,\n  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR)"
         ,0x199);
  io::Printer::Print(local_238->printer_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_228,local_1d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::PrintFieldDescriptor(const FieldDescriptor& field,
                                     bool is_extension) const {
  std::string options_string;
  field.options().SerializeToString(&options_string);
  std::map<std::string, std::string> m;
  m["name"] = field.name();
  m["full_name"] = field.full_name();
  m["index"] = StrCat(field.index());
  m["number"] = StrCat(field.number());
  m["type"] = StrCat(field.type());
  m["cpp_type"] = StrCat(field.cpp_type());
  m["label"] = StrCat(field.label());
  m["has_default_value"] = field.has_default_value() ? "True" : "False";
  m["default_value"] = StringifyDefaultValue(field);
  m["is_extension"] = is_extension ? "True" : "False";
  m["serialized_options"] = OptionsValue(options_string);
  m["json_name"] =
      field.has_json_name() ? ", json_name='" + field.json_name() + "'" : "";
  // We always set message_type and enum_type to None at this point, and then
  // these fields in correctly after all referenced descriptors have been
  // defined and/or imported (see FixForeignFieldsInDescriptors()).
  const char field_descriptor_decl[] =
      "_descriptor.FieldDescriptor(\n"
      "  name='$name$', full_name='$full_name$', index=$index$,\n"
      "  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n"
      "  has_default_value=$has_default_value$, "
      "default_value=$default_value$,\n"
      "  message_type=None, enum_type=None, containing_type=None,\n"
      "  is_extension=$is_extension$, extension_scope=None,\n"
      "  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR)";
  printer_->Print(m, field_descriptor_decl);
}